

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall ParserTest_Comments_Test::TestBody(ParserTest_Comments_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_498;
  AssertHelper local_478;
  Message local_470;
  allocator local_461;
  string local_460;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_408;
  Message local_400;
  allocator local_3f1;
  string local_3f0;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_398;
  Message local_390;
  allocator local_381;
  string local_380;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_328;
  Message local_320;
  allocator local_311;
  string local_310;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2b8;
  Message local_2b0;
  allocator local_2a1;
  string local_2a0;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_248;
  Message local_240;
  allocator local_231;
  string local_230;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d8;
  Message local_1d0;
  allocator local_1c1;
  string local_1c0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_168;
  Message local_160;
  allocator local_151;
  string local_150;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  allocator local_e1;
  string local_e0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  P parser;
  ParserTest_Comments_Test *this_local;
  
  anon_unknown.dwarf_38f65::P::P((P *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"// single line comment\n",&local_61);
  local_39 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_60);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_38,
               (AssertionResult *)"parser.parse(\"// single line comment\\n\")","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"// single line comment nonl",&local_e1);
  local_b9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_e0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b8,
               (AssertionResult *)"parser.parse(\"// single line comment nonl\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"/* multi-line comment */",&local_151);
  local_129 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,
               (AssertionResult *)"parser.parse(\"/* multi-line comment */\")","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"prop = /* comment */ \'val\'",&local_1c1);
  local_199 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_1c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_198,
               (AssertionResult *)"parser.parse(\"prop = /* comment */ \'val\'\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"prop = /*/ comment */ \'val\'",&local_231);
  local_209 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_208,
               (AssertionResult *)"parser.parse(\"prop = /*/ comment */ \'val\'\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"prop = /**/ \'val\'",&local_2a1);
  local_279 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_2a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_278,
               (AssertionResult *)"parser.parse(\"prop = /**/ \'val\'\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_310,"prop = /* comment /*nest*/ more */ \'val\'",&local_311);
  local_2e9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_310);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2e8,
               (AssertionResult *)"parser.parse(\"prop = /* comment /*nest*/ more */ \'val\'\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_380,"elem.id /* comment */ {prop = \'val\'}",&local_381);
  local_359 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_380);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_358,
               (AssertionResult *)"parser.parse(\"elem.id /* comment */ {prop = \'val\'}\")","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f0,"elem.id /* comment {prop = \'val\'}",&local_3f1);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_3f0);
  local_3c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_3c8,
               (AssertionResult *)"parser.parse(\"elem.id /* comment {prop = \'val\'}\")","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_460,"// comment\nelem { prop = \'val\' prop = \'val\' }",&local_461);
  local_439 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_460);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_498,(internal *)local_438,
               (AssertionResult *)
               "parser.parse(\"// comment\\nelem { prop = \'val\' prop = \'val\' }\")","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  anon_unknown.dwarf_38f65::P::~P((P *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParserTest, Comments) {
  P parser;
  EXPECT_TRUE(parser.parse("// single line comment\n"));
  EXPECT_TRUE(parser.parse("// single line comment nonl"));
  EXPECT_TRUE(parser.parse("/* multi-line comment */"));
  EXPECT_TRUE(parser.parse("prop = /* comment */ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /*/ comment */ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /**/ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /* comment /*nest*/ more */ 'val'"));
  EXPECT_TRUE(parser.parse("elem.id /* comment */ {prop = 'val'}"));
  EXPECT_FALSE(parser.parse("elem.id /* comment {prop = 'val'}"));
  EXPECT_TRUE(parser.parse("// comment\nelem { prop = 'val' prop = 'val' }"));
}